

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SignalBlocker.cc
# Opt level: O0

void __thiscall
SignalBlocker_scopedBlockPrevious_Test::TestBody(SignalBlocker_scopedBlockPrevious_Test *this)

{
  bool bVar1;
  byte bVar2;
  AssertionResult gtest_ar__4;
  AssertionResult gtest_ar__3;
  AssertionResult gtest_ar__2;
  SignalBlocker<sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>_> sb2;
  AssertionResult gtest_ar__1;
  SignalBlocker<sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>_> sb;
  AssertionResult gtest_ar_;
  Signal<void_()> s;
  BasicSignal<void_(),_std::lock_guard<std::mutex>_> *in_stack_fffffffffffffe08;
  BasicSignal<void_(),_std::lock_guard<std::mutex>_> *in_stack_fffffffffffffe10;
  int in_stack_fffffffffffffe1c;
  Message *in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe28;
  Type in_stack_fffffffffffffe2c;
  AssertHelper *in_stack_fffffffffffffe30;
  undefined7 in_stack_fffffffffffffe38;
  undefined1 in_stack_fffffffffffffe3f;
  BasicSignal<void_(),_std::lock_guard<std::mutex>_> *in_stack_fffffffffffffe40;
  string local_1b0 [24];
  Message *in_stack_fffffffffffffe68;
  AssertHelper *in_stack_fffffffffffffe70;
  AssertionResult local_178;
  string local_168 [55];
  undefined1 local_131;
  AssertionResult local_130 [2];
  string local_108 [55];
  undefined1 local_d1;
  AssertionResult local_d0 [2];
  uint local_a4;
  string local_a0 [55];
  byte local_69;
  AssertionResult local_68 [6];
  
  sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>::BasicSignal(in_stack_fffffffffffffe10);
  bVar1 = sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>::blocked
                    ((BasicSignal<void_(),_std::lock_guard<std::mutex>_> *)0x152ad9);
  local_69 = (bVar1 ^ 0xffU) & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_fffffffffffffe10,(bool *)in_stack_fffffffffffffe08,
             (type *)0x152afd);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_68);
  if (!bVar1) {
    testing::Message::Message(in_stack_fffffffffffffe20);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38),
               (char *)in_stack_fffffffffffffe30,
               (char *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
               (char *)in_stack_fffffffffffffe20);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c,(char *)in_stack_fffffffffffffe20
               ,in_stack_fffffffffffffe1c,(char *)in_stack_fffffffffffffe10);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe10);
    std::__cxx11::string::~string(local_a0);
    testing::Message::~Message((Message *)0x152bb6);
  }
  local_a4 = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x152bdb);
  if (local_a4 == 0) {
    sigs::SignalBlocker<sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>_>::SignalBlocker
              ((SignalBlocker<sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>_> *)
               in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
    local_d1 = sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>::blocked
                         ((BasicSignal<void_(),_std::lock_guard<std::mutex>_> *)0x152c0e);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffffe10,(bool *)in_stack_fffffffffffffe08,
               (type *)0x152c30);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_d0);
    if (!bVar1) {
      testing::Message::Message(in_stack_fffffffffffffe20);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38),
                 (char *)in_stack_fffffffffffffe30,
                 (char *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                 (char *)in_stack_fffffffffffffe20);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c,
                 (char *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c,
                 (char *)in_stack_fffffffffffffe10);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe10);
      std::__cxx11::string::~string(local_108);
      testing::Message::~Message((Message *)0x152ce9);
    }
    local_a4 = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x152d0e);
    if (local_a4 == 0) {
      sigs::SignalBlocker<sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>_>::SignalBlocker
                ((SignalBlocker<sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>_> *)
                 in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
      local_131 = sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>::blocked
                            ((BasicSignal<void_(),_std::lock_guard<std::mutex>_> *)0x152d41);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)in_stack_fffffffffffffe10,(bool *)in_stack_fffffffffffffe08,
                 (type *)0x152d63);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_130);
      if (!bVar1) {
        testing::Message::Message(in_stack_fffffffffffffe20);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((AssertionResult *)CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38),
                   (char *)in_stack_fffffffffffffe30,
                   (char *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                   (char *)in_stack_fffffffffffffe20);
        std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c,
                   (char *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c,
                   (char *)in_stack_fffffffffffffe10);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe10);
        std::__cxx11::string::~string(local_168);
        testing::Message::~Message((Message *)0x152e1c);
      }
      local_a4 = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x152e41);
      if (local_a4 == 0) {
        local_a4 = 0;
      }
      sigs::SignalBlocker<sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>_>::~SignalBlocker
                ((SignalBlocker<sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>_> *)
                 0x152e66);
      if (local_a4 == 0) {
        sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>::blocked
                  ((BasicSignal<void_(),_std::lock_guard<std::mutex>_> *)0x152e84);
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)in_stack_fffffffffffffe10,(bool *)in_stack_fffffffffffffe08,
                   (type *)0x152ea0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_178);
        if (!bVar1) {
          testing::Message::Message(in_stack_fffffffffffffe20);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((AssertionResult *)
                     CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38),
                     (char *)in_stack_fffffffffffffe30,
                     (char *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                     (char *)in_stack_fffffffffffffe20);
          std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c,
                     (char *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c,
                     (char *)in_stack_fffffffffffffe10);
          testing::internal::AssertHelper::operator=
                    (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe10);
          std::__cxx11::string::~string(local_1b0);
          testing::Message::~Message((Message *)0x152f3e);
        }
        local_a4 = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x152f63);
        if (local_a4 == 0) {
          local_a4 = 0;
        }
      }
    }
    sigs::SignalBlocker<sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>_>::~SignalBlocker
              ((SignalBlocker<sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>_> *)0x152f88)
    ;
    if (local_a4 == 0) {
      bVar1 = sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>::blocked
                        ((BasicSignal<void_(),_std::lock_guard<std::mutex>_> *)0x152fa6);
      bVar2 = (bVar1 ^ 0xffU) & 1;
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)in_stack_fffffffffffffe10,(bool *)in_stack_fffffffffffffe08,
                 (type *)0x152fc1);
      bVar1 = testing::AssertionResult::operator_cast_to_bool
                        ((AssertionResult *)&stack0xfffffffffffffe40);
      if (!bVar1) {
        testing::Message::Message(in_stack_fffffffffffffe20);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((AssertionResult *)CONCAT17(bVar2,in_stack_fffffffffffffe38),
                   (char *)in_stack_fffffffffffffe30,
                   (char *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                   (char *)in_stack_fffffffffffffe20);
        std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c,
                   (char *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c,
                   (char *)in_stack_fffffffffffffe10);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe10);
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffe08);
        testing::Message::~Message((Message *)0x153053);
      }
      local_a4 = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x153075);
      if (local_a4 == 0) {
        local_a4 = 0;
      }
    }
  }
  sigs::BasicSignal<void_(),_std::lock_guard<std::mutex>_>::~BasicSignal(in_stack_fffffffffffffe40);
  return;
}

Assistant:

TEST(SignalBlocker, scopedBlockPrevious)
{
  sigs::Signal<void()> s;
  ASSERT_FALSE(s.blocked());

  {
    sigs::SignalBlocker sb(s);
    ASSERT_TRUE(s.blocked());

    {
      // Already blocked.
      sigs::SignalBlocker sb2(s);
      ASSERT_TRUE(s.blocked());
    }

    // Must still be blocked at this point due to `sb`.
    ASSERT_TRUE(s.blocked());
  }

  ASSERT_FALSE(s.blocked());
}